

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O3

int __thiscall FNodeBuilder::CreateSeg(FNodeBuilder *this,int linenum,int sidenum)

{
  line_t *plVar1;
  DWORD DVar2;
  DWORD DVar3;
  uint uVar4;
  sector_t *psVar5;
  sector_t *psVar6;
  FPrivVert *pFVar7;
  FPrivSeg *pFVar8;
  FPrivSeg *pFVar9;
  int iVar10;
  line_t *plVar11;
  int iVar12;
  sector_t **ppsVar13;
  sector_t **ppsVar14;
  line_t *plVar15;
  int local_4c;
  
  plVar11 = this->Level->Lines;
  plVar1 = plVar11 + linenum;
  plVar15 = (line_t *)&plVar11[linenum].v2;
  if (sidenum == 0) {
    ppsVar13 = &plVar11[linenum].frontsector;
    ppsVar14 = &plVar11[linenum].backsector;
    plVar11 = plVar1;
  }
  else {
    ppsVar13 = &plVar11[linenum].backsector;
    ppsVar14 = &plVar11[linenum].frontsector;
    plVar11 = plVar15;
    plVar15 = plVar1;
  }
  psVar5 = *ppsVar14;
  psVar6 = *ppsVar13;
  if (plVar1->sidedef[sidenum] == (side_t *)0x0) {
    local_4c = -1;
  }
  else {
    local_4c = (int)((ulong)((long)plVar1->sidedef[sidenum] - (long)sides) >> 3) * 0x684bda13;
  }
  iVar12 = (int)plVar11->v1;
  pFVar7 = (this->Vertices).Array;
  DVar2 = pFVar7[iVar12].segs;
  iVar10 = (int)plVar15->v1;
  DVar3 = pFVar7[iVar10].segs2;
  TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Grow(&this->Segs,1);
  pFVar8 = (this->Segs).Array;
  uVar4 = (this->Segs).Count;
  pFVar8[uVar4].v1 = iVar12;
  pFVar8[uVar4].v2 = iVar10;
  pFVar8[uVar4].sidedef = local_4c;
  pFVar8[uVar4].linedef = linenum;
  pFVar8[uVar4].frontsector = psVar6;
  pFVar8[uVar4].backsector = psVar5;
  pFVar8[uVar4].next = 0xffffffff;
  pFVar8[uVar4].nextforvert = DVar2;
  pFVar8[uVar4].nextforvert2 = DVar3;
  pFVar9 = pFVar8 + uVar4;
  pFVar9->loopnum = 0;
  pFVar9->partner = 0xffffffff;
  *(undefined8 *)(&pFVar9->loopnum + 2) = 0xffffffffffffffff;
  pFVar8[uVar4].planefront = false;
  pFVar8[uVar4].hashnext = (FPrivSeg *)0x0;
  uVar4 = (this->Segs).Count;
  (this->Segs).Count = uVar4 + 1;
  pFVar7 = (this->Vertices).Array;
  pFVar7[iVar12].segs = uVar4;
  pFVar7[iVar10].segs2 = uVar4;
  return uVar4;
}

Assistant:

int FNodeBuilder::CreateSeg (int linenum, int sidenum)
{
	FPrivSeg seg;
	int segnum;

	seg.next = DWORD_MAX;
	seg.loopnum = 0;
	seg.partner = DWORD_MAX;
	seg.hashnext = NULL;
	seg.planefront = false;
	seg.planenum = DWORD_MAX;
	seg.storedseg = DWORD_MAX;

	if (sidenum == 0)
	{ // front
		seg.frontsector = Level.Lines[linenum].frontsector;
		seg.backsector = Level.Lines[linenum].backsector;
		seg.v1 = (int)(size_t)Level.Lines[linenum].v1;
		seg.v2 = (int)(size_t)Level.Lines[linenum].v2;
	}
	else
	{ // back
		seg.frontsector = Level.Lines[linenum].backsector;
		seg.backsector = Level.Lines[linenum].frontsector;
		seg.v2 = (int)(size_t)Level.Lines[linenum].v1;
		seg.v1 = (int)(size_t)Level.Lines[linenum].v2;
	}
	seg.linedef = linenum;
	side_t *sd = Level.Lines[linenum].sidedef[sidenum];
	seg.sidedef = sd != NULL? int(sd - sides) : int(NO_SIDE);
	seg.nextforvert = Vertices[seg.v1].segs;
	seg.nextforvert2 = Vertices[seg.v2].segs2;

	segnum = (int)Segs.Push (seg);
	Vertices[seg.v1].segs = segnum;
	Vertices[seg.v2].segs2 = segnum;
	D(Printf(PRINT_LOG, "Seg %4d: From line %d, side %s (%5d,%5d)-(%5d,%5d)  [%08x,%08x]-[%08x,%08x]\n", segnum, linenum, sidenum ? "back " : "front",
		Vertices[seg.v1].x>>16, Vertices[seg.v1].y>>16, Vertices[seg.v2].x>>16, Vertices[seg.v2].y>>16,
		Vertices[seg.v1].x, Vertices[seg.v1].y, Vertices[seg.v2].x, Vertices[seg.v2].y));

	return segnum;
}